

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

string * __thiscall
cmPolicies::GetPolicyWarning_abi_cxx11_(string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  ostream *poVar1;
  char *pcVar2;
  PolicyID id_00;
  ostringstream local_190 [8];
  ostringstream msg;
  PolicyID id_local;
  
  id_00 = (PolicyID)this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Policy ");
  pcVar2 = idToString(id_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," is not set: ");
  pcVar2 = idToShortDescription(id_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"  Run \"cmake --help-policy ");
  pcVar2 = idToString(id_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,
                  "\" for policy details.  Use the cmake_policy command to set the policy and suppress this warning."
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetPolicyWarning(cmPolicies::PolicyID id)
{
  std::ostringstream msg;
  msg << "Policy " << idToString(id)
      << " is not set: "
         ""
      << idToShortDescription(id)
      << "  "
         "Run \"cmake --help-policy "
      << idToString(id)
      << "\" for "
         "policy details.  "
         "Use the cmake_policy command to set the policy "
         "and suppress this warning.";
  return msg.str();
}